

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeDepSchema
          (Impl *this,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  Reader type_00;
  StringPtr scopeName_00;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_90;
  char *local_78;
  size_t sStack_70;
  SegmentReader *local_68;
  CapTableReader *pCStack_60;
  void *local_58;
  WirePointer *pWStack_50;
  StructDataBitCount local_48;
  StructPointerCount SStack_44;
  undefined2 uStack_42;
  int iStack_40;
  undefined4 uStack_3c;
  undefined1 auStack_38 [8];
  Binding binding;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_local;
  Impl *this_local;
  StringPtr scopeName_local;
  
  sStack_70 = scopeName.content.size_;
  local_78 = scopeName.content.ptr;
  auStack_38[0] = '\0';
  auStack_38[1] = false;
  auStack_38._2_2_ = 0;
  auStack_38._4_2_ = 0;
  auStack_38._6_2_ = 0;
  binding.which = '\0';
  binding.isImplicitParameter = false;
  binding.listDepth = 0;
  binding.paramIndex = 0;
  binding._6_2_ = 0;
  local_48 = type._reader.dataSize;
  SStack_44 = type._reader.pointerCount;
  uStack_42 = type._reader._38_2_;
  iStack_40 = type._reader.nestingLimit;
  uStack_3c = type._reader._44_4_;
  local_58 = type._reader.data;
  pWStack_50 = type._reader.pointers;
  local_68 = type._reader.segment;
  pCStack_60 = type._reader.capTable;
  binding.field_4 = (anon_union_8_2_eba6ea51_for_Binding_4)brandBindings;
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_90,brandBindings);
  scopeName_00.content.size_ = sStack_70;
  scopeName_00.content.ptr = local_78;
  type_00._reader.capTable = pCStack_60;
  type_00._reader.segment = local_68;
  type_00._reader.data = local_58;
  type_00._reader.pointers = pWStack_50;
  type_00._reader.dataSize = local_48;
  type_00._reader.pointerCount = SStack_44;
  type_00._reader._38_2_ = uStack_42;
  type_00._reader.nestingLimit = iStack_40;
  type_00._reader._44_4_ = uStack_3c;
  makeDep(this,(Binding *)auStack_38,type_00,scopeName_00,&local_90);
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_90);
  return (RawBrandedSchema *)binding._0_8_;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeDepSchema(
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  _::RawBrandedSchema::Binding binding;
  memset(&binding, 0, sizeof(binding));
  makeDep(binding, type, scopeName, brandBindings);
  return binding.schema;
}